

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandRecMerge3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char **__filename;
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  Gia_Man_t *pLib;
  Gia_Man_t *pGia;
  FILE *pFile;
  int nArgcNew;
  char **pArgvNew;
  char *pTemp;
  char *FileName;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"dh");
  if (iVar1 == -1) {
    iVar1 = Abc_NtkRecIsRunning3();
    if (iVar1 == 0) {
      Abc_Print(-1,"This command works for AIGs only after calling \"rec_start3\".\n");
      pAbc_local._4_4_ = 0;
    }
    else if (argc - globalUtilOptind == 1) {
      __filename = (char **)argv[globalUtilOptind];
      for (pArgvNew = __filename; *(char *)pArgvNew != '\0';
          pArgvNew = (char **)((long)pArgvNew + 1)) {
        if (*(char *)pArgvNew == '>') {
          *(undefined1 *)pArgvNew = 0x5c;
        }
      }
      __stream = fopen((char *)__filename,"r");
      if (__stream == (FILE *)0x0) {
        Abc_Print(-1,"Cannot open input file \"%s\". ",__filename);
        pcVar2 = Extra_FileGetSimilarName
                           ((char *)__filename,".aig",(char *)0x0,(char *)0x0,(char *)0x0,
                            (char *)0x0);
        if (pcVar2 != (char *)0x0) {
          Abc_Print(1,"Did you mean \"%s\"?",pcVar2);
        }
        Abc_Print(1,"\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        fclose(__stream);
        pLib = Gia_AigerRead((char *)__filename,0,1,0);
        if (pLib == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Reading AIGER has failed.\n");
          pAbc_local._4_4_ = 0;
        }
        else {
          Abc_NtkRecLibMerge3(pLib);
          Gia_ManStop(pLib);
          pAbc_local._4_4_ = 0;
        }
      }
    }
    else {
      Abc_Print(-1,"File name is not given on the command line.\n");
      pAbc_local._4_4_ = 1;
    }
  }
  else {
    Abc_Print(-2,"usage: rec_merge3 [-h] <file>\n");
    Abc_Print(-2,"\t         merge libraries\n");
    Abc_Print(-2,"\t-h     : print the command usage\n");
    Abc_Print(-2,"\t<file> : AIGER file with the library\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandRecMerge3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    char * FileName, * pTemp;
    char ** pArgvNew;
    int nArgcNew;
    FILE * pFile;
    Gia_Man_t * pGia = NULL;

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "dh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( !Abc_NtkRecIsRunning3() )
    {
        Abc_Print( -1, "This command works for AIGs only after calling \"rec_start3\".\n" );
        return 0;
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }
    else
    {
        // get the input file name
        FileName = pArgvNew[0];
        // fix the wrong symbol
        for ( pTemp = FileName; *pTemp; pTemp++ )
            if ( *pTemp == '>' )
                *pTemp = '\\';
        if ( (pFile = fopen( FileName, "r" )) == NULL )
        {
            Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
            if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
                Abc_Print( 1, "Did you mean \"%s\"?", FileName );
            Abc_Print( 1, "\n" );
            return 1;
        }
        fclose( pFile );
        pGia = Gia_AigerRead( FileName, 0, 1, 0 );
        if ( pGia == NULL )
        {
            Abc_Print( -1, "Reading AIGER has failed.\n" );
            return 0;
        }
    }
    Abc_NtkRecLibMerge3(pGia);
    Gia_ManStop( pGia );
    return 0;

usage:
    Abc_Print( -2, "usage: rec_merge3 [-h] <file>\n" );
    Abc_Print( -2, "\t         merge libraries\n" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : AIGER file with the library\n");
    return 1;
}